

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

bool __thiscall efsw::FileWatcherInotify::pathInWatches(FileWatcherInotify *this,string *path)

{
  bool bVar1;
  __type _Var2;
  pointer ppVar3;
  _Self local_38;
  _Self local_30;
  iterator it;
  Lock l;
  string *path_local;
  FileWatcherInotify *this_local;
  
  Lock::Lock((Lock *)&it,&this->mRealWatchesLock);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
       ::begin(&this->mRealWatches);
  do {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
         ::end(&this->mRealWatches);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_001190f2:
      Lock::~Lock((Lock *)&it);
      return this_local._7_1_;
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                       (&local_30);
    _Var2 = std::operator==(&(ppVar3->second->super_Watcher).Directory,path);
    if (_Var2) {
      this_local._7_1_ = true;
      goto LAB_001190f2;
    }
    std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator++(&local_30);
  } while( true );
}

Assistant:

bool FileWatcherInotify::pathInWatches( const std::string& path ) {
	Lock l( mRealWatchesLock );

	/// Search in the real watches, since it must allow adding a watch already watched as a subdir
	WatchMap::iterator it = mRealWatches.begin();

	for ( ; it != mRealWatches.end(); ++it )
		if ( it->second->Directory == path )
			return true;

	return false;
}